

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTcNamedArgTab::generate(CTcNamedArgTab *this)

{
  int iVar1;
  CTcDataStream *this_00;
  char *pcVar2;
  void *__buf;
  ulong __n;
  undefined8 *in_RDI;
  CTPNArg *arg_1;
  CTPNArg *arg;
  ulong idx0;
  ulong idx;
  ulong start;
  uchar in_stack_0000007f;
  CTcGenTarg *in_stack_00000080;
  undefined8 in_stack_ffffffffffffff88;
  CTcDataStream *in_stack_ffffffffffffff90;
  uint val;
  ulong in_stack_ffffffffffffff98;
  CTcCodeStream *pCVar3;
  CTcDataStream *in_stack_ffffffffffffffa0;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_18;
  
  CTcPrsNode::def_label_pos((CTcCodeLabel *)in_stack_ffffffffffffffa0);
  CTcGenTarg::write_op(in_stack_00000080,in_stack_0000007f);
  this_00 = (CTcDataStream *)CTcDataStream::get_ofs(&G_cs->super_CTcDataStream);
  CTcDataStream::write2(in_stack_ffffffffffffff90,(uint)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  CTcDataStream::write2(in_stack_ffffffffffffff90,(uint)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  local_18 = CTcDataStream::get_ofs(&G_cs->super_CTcDataStream);
  __n = local_18;
  for (local_28 = &CTPNArglistBase::get_arg_list_head((CTPNArglistBase *)*in_RDI)->super_CTPNArgBase
      ; local_28 != (CTPNArgBase *)0x0;
      local_28 = &CTPNArgBase::get_next_arg(local_28)->super_CTPNArgBase) {
    iVar1 = CTPNArgBase::is_named_param((CTPNArgBase *)0x288361);
    if (iVar1 != 0) {
      CTcDataStream::write2
                (in_stack_ffffffffffffff90,(uint)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    }
  }
  CTcDataStream::write2(in_stack_ffffffffffffff90,(uint)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  for (local_30 = &CTPNArglistBase::get_arg_list_head((CTPNArglistBase *)*in_RDI)->super_CTPNArgBase
      ; local_30 != (CTPNArgBase *)0x0;
      local_30 = &CTPNArgBase::get_next_arg(local_30)->super_CTPNArgBase) {
    iVar1 = CTPNArgBase::is_named_param((CTPNArgBase *)0x2883c3);
    if (iVar1 != 0) {
      CTcDataStream::get_ofs(&G_cs->super_CTcDataStream);
      CTcDataStream::write2_at
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                 (uint)((ulong)in_stack_ffffffffffffff90 >> 0x20));
      pCVar3 = G_cs;
      pcVar2 = CTPNArgBase::get_name((CTPNArgBase *)0x288423);
      __buf = (void *)CTPNArgBase::get_name_len((CTPNArgBase *)0x288432);
      CTcDataStream::write(&pCVar3->super_CTcDataStream,(int)pcVar2,__buf,__n);
      local_18 = local_18 + 2;
    }
  }
  CTcDataStream::get_ofs(&G_cs->super_CTcDataStream);
  val = (uint)(local_18 >> 0x20);
  CTcDataStream::write2_at(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,val);
  pCVar3 = G_cs;
  CTcDataStream::get_ofs(&G_cs->super_CTcDataStream);
  CTcDataStream::write2_at(this_00,(ulong)pCVar3,val);
  return;
}

Assistant:

void generate()
    {
        /* define the label location and start the table */
        CTcPrsNode::def_label_pos(lbl);
        G_cg->write_op(OPC_NAMEDARGTAB);

        /* write a placeholder for the table size */
        ulong start = G_cs->get_ofs();
        G_cs->write2(0);

        /* write the number of arguments in the list */
        G_cs->write2(cnt);

        /* write placeholders for the index entries */
        ulong idx = G_cs->get_ofs(), idx0 = idx;
        for (CTPNArg *arg = arglist->get_arg_list_head() ; arg != 0 ;
             arg = arg->get_next_arg())
        {
            /* if it's a named argument, write an index placeholder */
            if (arg->is_named_param())
                G_cs->write2(0);
        }

        /* write a final index marker, for computing the last item's length */
        G_cs->write2(0);

        /* write the strings */
        for (CTPNArg *arg = arglist->get_arg_list_head() ; arg != 0 ;
             arg = arg->get_next_arg())
        {
            /* if it's a named argument, write it out */
            if (arg->is_named_param())
            {
                /* write its index pointer */
                G_cs->write2_at(idx, G_cs->get_ofs() - idx0);

                /* write the string */
                G_cs->write(arg->get_name(), arg->get_name_len());

                /* advance the index pointer */
                idx += 2;
            }
        }

        /* write the final index marker */
        G_cs->write2_at(idx, G_cs->get_ofs() - idx0);

        /* go back and fill in the table length prefix */
        G_cs->write2_at(start, G_cs->get_ofs() - start - 2);
    }